

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O0

void __thiscall QProgressDialogPrivate::_q_disconnectOnClose(QProgressDialogPrivate *this)

{
  bool bVar1;
  QObject *p;
  QObject *this_00;
  char *pcVar2;
  QProgressDialogPrivate *in_RDI;
  QProgressDialog *q;
  
  p = (QObject *)q_func(in_RDI);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QObject> *)0x7b0fc2);
  if (bVar1) {
    this_00 = ::QPointer::operator_cast_to_QObject_((QPointer<QObject> *)0x7b0fe2);
    pcVar2 = QByteArray::operator_cast_to_char_((QByteArray *)0x7b0ff8);
    QObject::disconnect(p,"2canceled()",this_00,pcVar2);
    QPointer<QObject>::operator=((QPointer<QObject> *)this_00,p);
  }
  QByteArray::clear();
  return;
}

Assistant:

void QProgressDialogPrivate::_q_disconnectOnClose()
{
    Q_Q(QProgressDialog);
    if (receiverToDisconnectOnClose) {
        QObject::disconnect(q, SIGNAL(canceled()), receiverToDisconnectOnClose,
                            memberToDisconnectOnClose);
        receiverToDisconnectOnClose = nullptr;
    }
    memberToDisconnectOnClose.clear();
}